

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marginalTrek++.cpp
# Opt level: O2

int IsoSpec::verify_atom_cnt(int atomCnt)

{
  length_error *this;
  string sStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (atomCnt < 0x9fffff) {
    return atomCnt;
  }
  this = (length_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&sStack_58,0x9fffff);
  std::operator+(&local_38,
                 "Subisotopologue too large, size limit (that is, the maximum number of atoms of a single element in a molecule) is: "
                 ,&sStack_58);
  std::length_error::length_error(this,(string *)&local_38);
  __cxa_throw(this,&std::length_error::typeinfo,std::length_error::~length_error);
}

Assistant:

int verify_atom_cnt(int atomCnt)
{
    #if !ISOSPEC_BUILDING_OPENMS
    if(ISOSPEC_G_FACT_TABLE_SIZE-1 <= atomCnt)
        throw std::length_error("Subisotopologue too large, size limit (that is, the maximum number of atoms of a single element in a molecule) is: " + std::to_string(ISOSPEC_G_FACT_TABLE_SIZE-1));
    #endif
    return atomCnt;
}